

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharing.c
# Opt level: O2

Socket * ssh_connection_sharing_init
                   (char *host,int port,Conf *conf,LogContext *logctx,Plug *sshplug,
                   ssh_sharing_state **state)

{
  LogContext *ctx;
  ssh_sharing_state **ppsVar1;
  _Bool _Var2;
  _Bool can_downstream;
  int iVar3;
  char *pcVar4;
  ssh_sharing_state *ptr;
  tree234 *ptVar5;
  Socket *pSVar6;
  char *logtext;
  char *local_68;
  Socket *sock;
  LogContext *local_58;
  ssh_sharing_state **local_50;
  char *us_err;
  char *ds_err;
  Plug *local_38;
  
  _Var2 = conf_get_bool(conf,0xc0);
  if (!_Var2) {
    return (Socket *)0x0;
  }
  local_50 = state;
  _Var2 = conf_get_bool(conf,0xc1);
  local_58 = logctx;
  can_downstream = conf_get_bool(conf,0xc2);
  if (!_Var2 && !can_downstream) {
    return (Socket *)0x0;
  }
  pcVar4 = ssh_share_sockname(host,port,conf);
  local_38 = sshplug;
  ptr = (ssh_sharing_state *)safemalloc(1,0x38,0);
  (ptr->plug).vt = &ssh_sharing_listen_plugvt;
  ptr->listensock = (Socket *)0x0;
  ptr->cl = (ConnectionLayer *)0x0;
  sock = (Socket *)0x0;
  us_err = (char *)0x0;
  ds_err = (char *)0x0;
  logtext = (char *)0x0;
  local_68 = pcVar4;
  iVar3 = platform_ssh_share(pcVar4,conf,local_38,&ptr->plug,&sock,&logtext,&ds_err,&us_err,_Var2,
                             can_downstream);
  ppsVar1 = local_50;
  ctx = local_58;
  if (iVar3 == 2) {
    pSVar6 = (Socket *)0x0;
    logeventf(local_58,"Sharing this connection at %s",logtext);
    *local_50 = ptr;
    ptr->listensock = sock;
    ptVar5 = newtree234(share_connstate_cmp);
    ptr->connections = ptVar5;
    ptr->server_verstring = (char *)0x0;
    ptr->sockname = local_68;
    ptr->nextid = 1;
    goto LAB_00134f84;
  }
  if (iVar3 == 1) {
    logeventf(local_58,"Using existing shared connection at %s",logtext);
    *ppsVar1 = (ssh_sharing_state *)0x0;
    safefree(ptr);
    safefree(local_68);
    pSVar6 = sock;
    goto LAB_00134f84;
  }
  pSVar6 = (Socket *)0x0;
  if (iVar3 != 0) goto LAB_00134f84;
  if (logtext == (char *)0x0) {
    if (ds_err != (char *)0x0) {
      logeventf(local_58,"Could not set up connection sharing as downstream: %s");
    }
    if (us_err != (char *)0x0) {
      pcVar4 = "Could not set up connection sharing as upstream: %s";
      goto LAB_00134f59;
    }
  }
  else {
    pcVar4 = "Could not set up connection sharing: %s";
LAB_00134f59:
    logeventf(ctx,pcVar4);
  }
  if (sock != (Socket *)0x0) {
    __assert_fail("sock == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/sharing.c",
                  0x857,
                  "Socket *ssh_connection_sharing_init(const char *, int, Conf *, LogContext *, Plug *, ssh_sharing_state **)"
                 );
  }
  *ppsVar1 = (ssh_sharing_state *)0x0;
  safefree(ptr);
  safefree(local_68);
  pSVar6 = (Socket *)0x0;
LAB_00134f84:
  safefree(logtext);
  safefree(ds_err);
  safefree(us_err);
  return pSVar6;
}

Assistant:

Socket *ssh_connection_sharing_init(
    const char *host, int port, Conf *conf, LogContext *logctx,
    Plug *sshplug, ssh_sharing_state **state)
{
    int result;
    bool can_upstream, can_downstream;
    char *logtext, *ds_err, *us_err;
    char *sockname;
    Socket *sock, *toret = NULL;
    struct ssh_sharing_state *sharestate;

    if (!conf_get_bool(conf, CONF_ssh_connection_sharing))
        return NULL;                   /* do not share anything */
    can_upstream = share_can_be_upstream &&
        conf_get_bool(conf, CONF_ssh_connection_sharing_upstream);
    can_downstream = share_can_be_downstream &&
        conf_get_bool(conf, CONF_ssh_connection_sharing_downstream);
    if (!can_upstream && !can_downstream)
        return NULL;

    sockname = ssh_share_sockname(host, port, conf);

    /*
     * Create a data structure for the listening plug if we turn out
     * to be an upstream.
     */
    sharestate = snew(struct ssh_sharing_state);
    sharestate->plug.vt = &ssh_sharing_listen_plugvt;
    sharestate->listensock = NULL;
    sharestate->cl = NULL;

    /*
     * Now hand off to a per-platform routine that either connects to
     * an existing upstream (using 'ssh' as the plug), establishes our
     * own upstream (using 'sharestate' as the plug), or forks off a
     * separate upstream and then connects to that. It will return a
     * code telling us which kind of socket it put in 'sock'.
     */
    sock = NULL;
    logtext = ds_err = us_err = NULL;
    result = platform_ssh_share(
        sockname, conf, sshplug, &sharestate->plug, &sock, &logtext,
        &ds_err, &us_err, can_upstream, can_downstream);
    switch (result) {
      case SHARE_NONE:
        /*
         * We aren't sharing our connection at all (e.g. something
         * went wrong setting the socket up). Free the upstream
         * structure and return NULL.
         */

        if (logtext) {
            /* For this result, if 'logtext' is not NULL then it is an
             * error message indicating a reason why connection sharing
             * couldn't be set up _at all_ */
            logeventf(logctx,
                      "Could not set up connection sharing: %s", logtext);
        } else {
            /* Failing that, ds_err and us_err indicate why we
             * couldn't be a downstream and an upstream respectively */
            if (ds_err)
                logeventf(logctx, "Could not set up connection sharing"
                          " as downstream: %s", ds_err);
            if (us_err)
                logeventf(logctx, "Could not set up connection sharing"
                          " as upstream: %s", us_err);
        }

        assert(sock == NULL);
        *state = NULL;
        sfree(sharestate);
        sfree(sockname);
        break;

      case SHARE_DOWNSTREAM:
        /*
         * We are downstream, so free sharestate which it turns out we
         * don't need after all, and return the downstream socket as a
         * replacement for an ordinary SSH connection.
         */

        /* 'logtext' is a local endpoint address */
        logeventf(logctx, "Using existing shared connection at %s", logtext);

        *state = NULL;
        sfree(sharestate);
        sfree(sockname);
        toret = sock;
        break;

      case SHARE_UPSTREAM:
        /*
         * We are upstream. Set up sharestate properly and pass a copy
         * to the caller; return NULL, to tell ssh.c that it has to
         * make an ordinary connection after all.
         */

        /* 'logtext' is a local endpoint address */
        logeventf(logctx, "Sharing this connection at %s", logtext);

        *state = sharestate;
        sharestate->listensock = sock;
        sharestate->connections = newtree234(share_connstate_cmp);
        sharestate->server_verstring = NULL;
        sharestate->sockname = sockname;
        sharestate->nextid = 1;
        break;
    }

    sfree(logtext);
    sfree(ds_err);
    sfree(us_err);
    return toret;
}